

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O1

size_t embree::SceneGraph::sizeOfType(Tag ty)

{
  runtime_error *this;
  
  if (ty < PTY_LIST) {
    return *(size_t *)(&DAT_00258200 + (ulong)ty * 8);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid type");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t sizeOfType(Type::Tag ty) 
    {
      switch (ty) {
      case Type::PTY_CHAR : return 1;
      case Type::PTY_UCHAR : return 1;
      case Type::PTY_SHORT : return 2;
      case Type::PTY_USHORT : return 2;
      case Type::PTY_INT : return 4;
      case Type::PTY_UINT : return 4;
      case Type::PTY_FLOAT : return 4;
      case Type::PTY_DOUBLE : return 8;
      default : throw std::runtime_error("invalid type");
      }
    }